

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSLCopy.cpp
# Opt level: O2

void XPMP2::CSLObj::SetOtherObjCopyResult(bool bResult)

{
  __type _Var1;
  CSLModel *pCVar2;
  _List_node_base *p_Var3;
  string local_40;
  
  pCVar2 = CSLModelByKey((string *)&gThreadCSLkey_abi_cxx11_,(iterator *)0x0);
  if (pCVar2 == (CSLModel *)0x0) {
    if (3 < glob) {
      return;
    }
    StripXPSysDir(&local_40,(string *)&gThreadPath_abi_cxx11_);
    LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/CSLCopy.cpp"
           ,0xe1,"SetOtherObjCopyResult",logERR,"Copying %s: CSLModel \'%s\' not found!",
           local_40._M_dataplus._M_p,gThreadCSLkey_abi_cxx11_);
  }
  else {
    p_Var3 = (_List_node_base *)&pCVar2->listObj;
    while (p_Var3 = (((_List_base<XPMP2::CSLObj,_std::allocator<XPMP2::CSLObj>_> *)&p_Var3->_M_next)
                    ->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var3 != (_List_node_base *)&pCVar2->listObj) {
      _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (p_Var3 + 3),
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &gThreadPath_abi_cxx11_);
      if (_Var1) {
        SetCopyResult((CSLObj *)(p_Var3 + 1),bResult);
        return;
      }
    }
    if (3 < glob) {
      return;
    }
    StripXPSysDir(&local_40,(string *)&gThreadPath_abi_cxx11_);
    LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/CSLCopy.cpp"
           ,0xdc,"SetOtherObjCopyResult",logERR,"Copying %s: CSLObj not found in CSLModel \'%s\'!",
           local_40._M_dataplus._M_p,gThreadCSLkey_abi_cxx11_);
  }
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void CSLObj::SetOtherObjCopyResult (bool bResult)
{
    // Look for the CSLObj using the stored CSLId and path
    mapCSLModelTy::iterator cslIter;
    CSLModel* pCsl = CSLModelByKey(gThreadCSLkey);
    if (pCsl) {
        // find the object by path
        listCSLObjTy::iterator iter = std::find_if(pCsl->listObj.begin(),
                                                   pCsl->listObj.end(),
                                                   [](const CSLObj& o)
                                                   { return o.path == gThreadPath; });
        if (iter != pCsl->listObj.end())
            // Did find the CSL object!
            iter->SetCopyResult(bResult);
        else {
            LOG_MSG(logERR, ERR_CPY_OBJ_NOT_FOUND,
                    StripXPSysDir(gThreadPath).c_str(),
                    gThreadCSLkey.c_str());
        }
    } else {
        LOG_MSG(logERR, ERR_CPY_MDL_NOT_FOUND,
                StripXPSysDir(gThreadPath).c_str(),
                gThreadCSLkey.c_str());
    }
}